

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * decl_check_access_specifier(gnode_t *node)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint32_t uVar4;
  gtoken_t gVar5;
  bool bVar6;
  long local_60;
  long local_58;
  _Bool is_private_2;
  gnode_class_decl_t *cdec_node;
  _Bool is_private_1;
  gnode_function_decl_t *fdec_node;
  gnode_var_t *var;
  _Bool is_private;
  gnode_variable_decl_t *vdec_node;
  gnode_t *node_local;
  
  if (node->tag == NODE_VARIABLE_DECL) {
    if (node[1].refcount == 0) {
      bVar6 = false;
      lVar1._0_4_ = node[1].token.type;
      lVar1._4_4_ = node[1].token.lineno;
      if (lVar1 == 0) {
        local_58 = 0;
      }
      else {
        local_58 = **(long **)&node[1].token;
      }
      if (local_58 != 0) {
        if (**(long **)&node[1].token == 0) {
          local_60 = 0;
        }
        else {
          local_60 = **(long **)(*(long *)&node[1].token + 0x10);
        }
        bVar6 = false;
        if (*(long *)(local_60 + 0x50) != 0) {
          bVar6 = **(char **)(local_60 + 0x50) == '_';
        }
      }
      uVar4 = 0x1d;
      if (bVar6) {
        uVar4 = 0x1a;
      }
      node[1].refcount = uVar4;
    }
  }
  else if (node->tag == NODE_FUNCTION_DECL) {
    lVar2._0_4_ = node[1].token.colno;
    lVar2._4_4_ = node[1].token.position;
    if ((lVar2 != 0) && (node[1].block_length == 0)) {
      uVar4 = 0x1d;
      if (**(char **)&node[1].token.colno == '_') {
        uVar4 = 0x1a;
      }
      node[1].block_length = uVar4;
    }
  }
  else if (((node->tag == NODE_CLASS_DECL) &&
           (lVar3._0_4_ = node[1].token.colno, lVar3._4_4_ = node[1].token.position, lVar3 != 0)) &&
          (node[1].token.type == TOK_EOF)) {
    gVar5 = TOK_KEY_PUBLIC;
    if (**(char **)&node[1].token.colno == '_') {
      gVar5 = TOK_KEY_PRIVATE;
    }
    node[1].token.type = gVar5;
  }
  return node;
}

Assistant:

static gnode_t *decl_check_access_specifier (gnode_t *node) {
    // set proper access specifiers
    // default is PUBLIC but if IDENTIFIER begins with _ then set it to PRIVATE
    if (node->tag == NODE_VARIABLE_DECL) {
        // default access specifier for variables is TOK_KEY_PUBLIC
        gnode_variable_decl_t *vdec_node = (gnode_variable_decl_t *)node;
        if (vdec_node->access == 0) {
            bool is_private = false;
            if (gnode_array_size(vdec_node->decls) > 0) {
                gnode_var_t *var = (gnode_var_t *)gnode_array_get(vdec_node->decls, 0);
                is_private = (var->identifier && var->identifier[0] == '_');
            }
            vdec_node->access = (is_private) ? TOK_KEY_PRIVATE : TOK_KEY_PUBLIC;
        }
    } else if (node->tag == NODE_FUNCTION_DECL) {
        // default access specifier for functions is PUBLIC
        gnode_function_decl_t *fdec_node = (gnode_function_decl_t *)node;
        if (!fdec_node->identifier)  return node;
        bool is_private = (fdec_node->identifier[0] == '_');
        if (fdec_node->access == 0) fdec_node->access = (is_private) ? TOK_KEY_PRIVATE : TOK_KEY_PUBLIC;
    } else if (node->tag == NODE_CLASS_DECL) {
        // default access specifier for inner class declarations is PUBLIC
        gnode_class_decl_t *cdec_node = (gnode_class_decl_t *)node;
        if (!cdec_node->identifier)  return node;
        bool is_private = (cdec_node->identifier[0] == '_');
        if (cdec_node->access == 0) cdec_node->access = (is_private) ? TOK_KEY_PRIVATE : TOK_KEY_PUBLIC;
    }

    return node;
}